

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthRoute.cpp
# Opt level: O2

void __thiscall SynthRoute::disableExclusiveMidiMode(SynthRoute *this)

{
  MidiSession *midiSession;
  iterator iVar1;
  QDebug local_40;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  if ((this->exclusiveMidiMode == true) && ((this->midiSessions).d.size != 0)) {
    iVar1 = QList<MidiSession_*>::begin(&this->midiSessions);
    midiSession = *iVar1.i;
    removeMidiSession(this,midiSession);
    this->exclusiveMidiMode = false;
    local_38 = 2;
    local_24 = 0;
    local_34 = 0;
    uStack_2c = 0;
    local_20 = "default";
    QMessageLogger::debug();
    QDebug::operator<<(&local_40,"SynthRoute: exclusiveMidiMode disabled");
    QDebug::~QDebug(&local_40);
    exclusiveMidiSessionRemoved(this,midiSession);
  }
  return;
}

Assistant:

void SynthRoute::disableExclusiveMidiMode() {
	if (exclusiveMidiMode && hasMIDISessions()) {
		MidiSession *midiSession = midiSessions.first();
		removeMidiSession(midiSession);
		exclusiveMidiMode = false;
		qDebug() << "SynthRoute: exclusiveMidiMode disabled";
		emit exclusiveMidiSessionRemoved(midiSession);
	}
}